

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O3

void __thiscall
QExplicitlySharedDataPointer<QPicturePrivate>::~QExplicitlySharedDataPointer
          (QExplicitlySharedDataPointer<QPicturePrivate> *this)

{
  QPicturePrivate *pQVar1;
  QPaintEngine *pQVar2;
  
  pQVar1 = (this->d).ptr;
  if (pQVar1 != (QPicturePrivate *)0x0) {
    LOCK();
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i == 0) {
      pQVar1 = (this->d).ptr;
      if (pQVar1 != (QPicturePrivate *)0x0) {
        QArrayDataPointer<QPen>::~QArrayDataPointer(&(pQVar1->pen_list).d);
        QArrayDataPointer<QBrush>::~QArrayDataPointer(&(pQVar1->brush_list).d);
        QArrayDataPointer<QPixmap>::~QArrayDataPointer(&(pQVar1->pixmap_list).d);
        QArrayDataPointer<QImage>::~QArrayDataPointer(&(pQVar1->image_list).d);
        pQVar2 = (pQVar1->paintEngine).d;
        if (pQVar2 != (QPaintEngine *)0x0) {
          (*pQVar2->_vptr_QPaintEngine[1])();
        }
        QBuffer::~QBuffer(&pQVar1->pictb);
      }
      operator_delete(pQVar1,0xb8);
      return;
    }
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }